

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.h
# Opt level: O2

void __thiscall xLearn::LinearScore::~LinearScore(LinearScore *this)

{
  Score::~Score(&this->super_Score);
  operator_delete(this);
  return;
}

Assistant:

~LinearScore() { }